

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_type.h
# Opt level: O0

bool date::rfc3339::read<std::istreambuf_iterator<char,std::char_traits<char>>>
               (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
               istreambuf_iterator<char,_std::char_traits<char>_> *end,parts *value)

{
  bool bVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar2;
  branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
  *branches_1;
  unsigned_integer_t<short,_2U,_2U> *in_R8;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined1 local_1c0 [16];
  _Head_base<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_false> local_1b0;
  branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
  local_1a8;
  character_t<char> local_18a;
  date local_189 [8];
  fraction_t<unsigned_int,_9U> local_168;
  character_t<char> local_159;
  unsigned_integer_t<unsigned_char,_2U,_2U> local_158 [2];
  value_type_conflict1 *local_148;
  undefined1 local_139 [16];
  undefined1 local_129 [16];
  undefined1 local_119 [16];
  undefined1 local_109 [16];
  undefined1 local_f9 [9];
  undefined1 local_f0 [8];
  tuple<date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
  fmt;
  undefined1 auStack_60 [4];
  offset_type offset_minutes;
  offset_type offset_hours;
  parts dt;
  parts *value_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *end_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *pos_local;
  
  dt._8_8_ = value;
  piVar2 = skip_spaces<std::istreambuf_iterator<char,std::char_traits<char>>>(pos,end);
  pos->_M_sbuf = piVar2->_M_sbuf;
  pos->_M_c = piVar2->_M_c;
  bVar1 = std::operator==(pos,end);
  if (bVar1) {
    pos_local._7_1_ = false;
  }
  else {
    memset(auStack_60,0,0x10);
    parts::parts((parts *)auStack_60);
    memset(auStack_60,0,0x10);
    fmt.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>._M_head_impl.
    value._6_2_ = 0;
    fmt.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>._M_head_impl.
    value._4_2_ = 0;
    local_f9._1_8_ = unsigned_integer<4u,4u,unsigned_short>((unsigned_short *)auStack_60);
    local_f9[0] = character<char,char>('-');
    local_109._1_8_ = unsigned_integer<2u,2u,unsigned_char>(auStack_60 + 2);
    local_109[0] = character<char,char>('-');
    local_119._1_8_ = unsigned_integer<2u,2u,unsigned_char>(auStack_60 + 3);
    local_119[0] = character<char,char>('T');
    local_129._1_8_ = unsigned_integer<2u,2u,unsigned_char>((uchar *)&offset_minutes);
    local_129[0] = character<char,char>(':');
    local_139._1_8_ = unsigned_integer<2u,2u,unsigned_char>((uchar *)((long)&offset_minutes + 1));
    local_139[0] = character<char,char>(':');
    local_148 = (value_type_conflict1 *)
                unsigned_integer<2u,2u,unsigned_char>((uchar *)&offset_hours);
    local_159 = character<char,char>('.');
    local_168 = fraction<9u,unsigned_int>((uint *)&dt);
    optional<date::character_t<char>,date::fraction_t<unsigned_int,9u>>
              ((date *)local_158,&local_159,&local_168);
    local_18a = character<char,char>('Z');
    branch<date::character_t<char>>(local_189,&local_18a);
    local_1b0._M_head_impl =
         signed_integer<2u,2u,true,short>
                   ((short *)((long)&fmt.
                                     super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>
                                     ._M_head_impl.value + 6));
    local_1c0[0xf] = character<char,char>(':');
    local_1c0._0_8_ =
         unsigned_integer<2u,2u,short>
                   ((short *)((long)&fmt.
                                     super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>
                                     ._M_head_impl.value + 4));
    branches_1 = (branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
                  *)local_1c0;
    branch<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>
              (&local_1a8,(date *)&local_1b0,
               (signed_integer_t<short,_2U,_2U,_true> *)(local_1c0 + 0xf),
               (character_t<char> *)branches_1,in_R8);
    cases<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>
              ((cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
                *)((long)&local_189[0].year + 1),local_189,
               (branch_t<date::character_t<char>_> *)&local_1a8,branches_1);
    format<date::unsigned_integer_t<unsigned_short,4u,4u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>>
              ((tuple<date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                *)local_f0,(date *)(local_f9 + 1),
               (unsigned_integer_t<unsigned_short,_4U,_4U> *)local_f9,
               (character_t<char> *)(local_109 + 1),
               (unsigned_integer_t<unsigned_char,_2U,_2U> *)local_109,
               (character_t<char> *)(local_119 + 1),
               (unsigned_integer_t<unsigned_char,_2U,_2U> *)local_119,
               (character_t<char> *)(local_129 + 1),
               (unsigned_integer_t<unsigned_char,_2U,_2U> *)local_129,
               (character_t<char> *)(local_139 + 1),
               (unsigned_integer_t<unsigned_char,_2U,_2U> *)local_139,
               (character_t<char> *)&local_148,local_158,
               (optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_> *)
               ((long)&local_189[0].year + 1),
               (cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
                *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    bVar1 = read<std::istreambuf_iterator<char,std::char_traits<char>>,date::unsigned_integer_t<unsigned_short,4u,4u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>>
                      (pos,end,(tuple<date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                *)local_f0);
    if ((bVar1) && (bVar1 = validate((parts *)auStack_60), bVar1)) {
      *(undefined8 *)dt._8_8_ = _auStack_60;
      *(undefined4 *)(dt._8_8_ + 8) = dt._0_4_;
      *(undefined2 *)(dt._8_8_ + 0xc) = dt._4_2_;
      if (fmt.
          super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
          .super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>.
          _M_head_impl.value._6_2_ < 1) {
        fmt.
        super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
        .super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>._M_head_impl
        .value._4_2_ = -fmt.
                        super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                        .
                        super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>
                        ._M_head_impl.value._4_2_;
      }
      *(short *)(dt._8_8_ + 0xc) =
           fmt.
           super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
           .super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>.
           _M_head_impl.value._6_2_ * 0x3c +
           fmt.
           super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
           .super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>.
           _M_head_impl.value._4_2_;
      pos_local._7_1_ = true;
    }
    else {
      pos_local._7_1_ = false;
    }
  }
  return pos_local._7_1_;
}

Assistant:

static bool read(Iterator& pos, const Iterator& end, parts& value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;

        pos = skip_spaces(pos, end);
        if (pos == end)
            return false;

        parts dt{};
        std::memset(static_cast<void*>(&dt), 0, sizeof(parts));

        offset_type offset_hours = 0;
        offset_type offset_minutes = 0;
        auto fmt = format(
            unsigned_integer<4, 4>(dt.year),   character<char_type>('-'),
            unsigned_integer<2, 2>(dt.month),  character<char_type>('-'),
            unsigned_integer<2, 2>(dt.day),    character<char_type>('T'),
            unsigned_integer<2, 2>(dt.hour),   character<char_type>(':'),
            unsigned_integer<2, 2>(dt.minute), character<char_type>(':'),
            unsigned_integer<2, 2>(dt.second),
            optional(
                character<char_type>('.'),
                fraction<9>(dt.nanosecond)),
            cases(
                branch(
                    character<char_type>('Z')),
                branch(
                    signed_integer<2, 2, SignRequired>(offset_hours),
                    character<char_type>(':'),
                    unsigned_integer<2, 2>(offset_minutes))));

        if (!::date::read(pos, end, fmt) || !validate(dt))
            return false;

        value = dt;
        value.offset_in_minutes = offset_hours * 60 + (offset_hours > 0 ? offset_minutes : -offset_minutes);
        return true;
    }